

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O1

void * threadsafe_mem_leak_operator_new_array_debug(size_t size,char *file,size_t line)

{
  MemoryLeakDetector *pMVar1;
  SimpleMutex *mtx;
  TestMemoryAllocator *allocator;
  char *pcVar2;
  undefined8 *puVar3;
  MemLeakScopedMutex lock;
  ScopedMutexLock SStack_28;
  
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  mtx = MemoryLeakDetector::getMutex(pMVar1);
  ScopedMutexLock::ScopedMutexLock(&SStack_28,mtx);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  allocator = getCurrentNewArrayAllocator();
  pcVar2 = MemoryLeakDetector::allocMemory(pMVar1,allocator,size,file,line,false);
  if (pcVar2 != (char *)0x0) {
    ScopedMutexLock::~ScopedMutexLock(&SStack_28);
    return pcVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = srand;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

UT_THROW(std::bad_alloc)
{
    MemLeakScopedMutex lock;
    void* memory = MemoryLeakWarningPlugin::getGlobalDetector()->allocMemory(getCurrentNewArrayAllocator(), size, file, line);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}